

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::validateKTXcubemapIncomplete
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  uint8_t value;
  int popCount;
  byte local_29;
  uint local_28;
  uint32_t local_24;
  
  this->foundKTXcubemapIncomplete = true;
  local_24 = size;
  if ((size != 1) &&
     (error<unsigned_int&>(this,&Metadata::KTXcubemapIncompleteInvalidSize,&local_24), local_24 == 0
     )) {
    return;
  }
  local_29 = *data;
  if (0x3f < local_29) {
    error<unsigned_char&>(this,&Metadata::KTXcubemapIncompleteInvalidBitSet,&local_29);
  }
  local_29 = local_29 & 0x3f;
  uVar1 = popcount<unsigned_char>(local_29);
  local_28 = uVar1;
  if (uVar1 == 6) {
    warning<>(this,&Metadata::KTXcubemapIncompleteAllBitsSet);
  }
  else if (uVar1 == 0) {
    error<>(this,&Metadata::KTXcubemapIncompleteNoBitSet);
    goto LAB_0018c46c;
  }
  if ((this->header).layerCount % uVar1 != 0) {
    error<unsigned_int&,int_const&>
              (this,&Metadata::KTXcubemapIncompleteIncompatibleLayerCount,&(this->header).layerCount
               ,(int *)&local_28);
  }
LAB_0018c46c:
  if ((this->header).faceCount != 1) {
    error<unsigned_int&>
              (this,&Metadata::KTXcubemapIncompleteWithFaceCountNot1,&(this->header).faceCount);
  }
  if ((this->header).pixelHeight != (this->header).pixelWidth) {
    error<unsigned_int&,unsigned_int&>
              (this,&HeaderData::CubeHeightWidthMismatch,&(this->header).pixelWidth,
               &(this->header).pixelHeight);
  }
  if ((this->header).pixelDepth != 0) {
    error<unsigned_int&>(this,&HeaderData::CubeWithDepth,&(this->header).pixelDepth);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXcubemapIncomplete(const uint8_t* data, uint32_t size) {
    foundKTXcubemapIncomplete = true;

    if (size != 1)
        error(Metadata::KTXcubemapIncompleteInvalidSize, size);

    if (size == 0)
        return;

    uint8_t value = *data;

    if (size > 0 && (value & 0b11000000u) != 0)
        error(Metadata::KTXcubemapIncompleteInvalidBitSet, value);
    value = value & 0b00111111u; // Error recovery

    const auto popCount = popcount(value);
    if (popCount == 6)
        warning(Metadata::KTXcubemapIncompleteAllBitsSet);

    if (popCount == 0)
        error(Metadata::KTXcubemapIncompleteNoBitSet);

    if (popCount != 0 && (header.layerCount % popCount != 0))
        error(Metadata::KTXcubemapIncompleteIncompatibleLayerCount, header.layerCount, popCount);

    if (header.faceCount != 1)
        error(Metadata::KTXcubemapIncompleteWithFaceCountNot1, header.faceCount);

    if (header.pixelHeight != header.pixelWidth)
        error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0)
        error(HeaderData::CubeWithDepth, header.pixelDepth);
}